

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O1

uint llvm::dwarf::AttributeVersion(Attribute Attribute)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = Attribute - 1 & 0xffff;
  uVar1 = 0;
  if (uVar2 < 0x8c) {
    uVar1 = *(uint *)(&DAT_00e6f3e0 + (ulong)uVar2 * 4);
  }
  return uVar1;
}

Assistant:

unsigned llvm::dwarf::AttributeVersion(dwarf::Attribute Attribute) {
  switch (Attribute) {
  default:
    return 0;
#define HANDLE_DW_AT(ID, NAME, VERSION, VENDOR)                                \
  case DW_AT_##NAME:                                                           \
    return VERSION;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}